

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O2

int test_get(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = test_get_number(1);
  iVar2 = test_get_number(2);
  iVar3 = test_get_number(3);
  iVar4 = test_get_number(4);
  iVar5 = test_get_number(5);
  return iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
}

Assistant:

int test_get(void) {
	int ret = 0;

	ret += test_get_number(1); // plain response

#if !defined(NHR_NO_GZIP)
	ret += test_get_number(2); // deflate response
	ret += test_get_number(3); // gziped response
#endif

	ret += test_get_number(4); // status code 418

#if !defined(NHR_NO_RECV_CHUNKS)
	ret += test_get_number(5); // chunked, total 1024, chunk_size 375, delay 1
#endif

	return ret;
}